

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlParseJson.c
# Opt level: O2

JL_STATUS SkipWhiteSpace(ParseParameters *Params,char *pNextChar)

{
  char cVar1;
  char cVar2;
  byte bVar3;
  char *pcVar4;
  byte bVar5;
  ulong uVar6;
  char cVar7;
  
  uVar6 = Params->StringIndex;
  bVar5 = 0;
  bVar3 = 0;
  do {
    if (Params->JsonStringLength <= uVar6) {
      return JL_STATUS_END_OF_DATA;
    }
    pcVar4 = Params->JsonString;
    cVar1 = pcVar4[uVar6 + 1];
    if (cVar1 == '\0') {
      cVar7 = '\0';
    }
    else {
      cVar7 = pcVar4[uVar6 + 2];
    }
    cVar2 = pcVar4[uVar6];
    if ((bool)(bVar3 & cVar2 == '\n')) goto switchD_0011ba6e_caseD_9;
    if ((bool)(cVar1 != '/' | ~bVar5 | cVar2 != '*')) {
      if (!(bool)(bVar5 | bVar3)) {
        bVar5 = 0;
        switch(cVar2) {
        case '\t':
        case '\n':
        case '\r':
          break;
        case '\v':
        case '\f':
          bVar3 = Params->IsJson5;
          if ((_Bool)bVar3 == false) {
LAB_0011ba86:
            if (((cVar1 == -0x60) && ((bVar3 & 1) != 0)) && (cVar2 == -0x3e)) {
              uVar6 = uVar6 + 1;
            }
            else {
              if ((bVar3 & 1) == 0) {
LAB_0011bb0f:
                *pNextChar = cVar2;
                return JL_STATUS_SUCCESS;
              }
              if (((cVar2 != -0x11) || (cVar1 != -0x45)) || (cVar7 != -0x41)) {
                if (cVar2 == '/' && cVar1 == '/') {
                  bVar3 = 1;
                  goto LAB_0011ba3c;
                }
                if ((cVar2 != '/') || (cVar1 != '*')) goto LAB_0011bb0f;
                uVar6 = uVar6 + 1;
                bVar5 = 1;
                break;
              }
              uVar6 = uVar6 + 2;
            }
          }
          bVar5 = 0;
          break;
        default:
          bVar5 = 0;
          if (cVar2 != ' ') {
            bVar3 = Params->IsJson5;
            goto LAB_0011ba86;
          }
        }
switchD_0011ba6e_caseD_9:
        bVar3 = 0;
      }
    }
    else {
LAB_0011ba3c:
      uVar6 = uVar6 + 1;
      bVar5 = 0;
    }
    uVar6 = uVar6 + 1;
    Params->StringIndex = uVar6;
  } while( true );
}

Assistant:

static
JL_STATUS
    SkipWhiteSpace
    (
        ParseParameters*    Params,
        char*               pNextChar
    )
{
    JL_STATUS jlStatus;
    bool inSingleLineComment = false;
    bool inMultiLineComment = false;

    jlStatus = JL_STATUS_END_OF_DATA;
    while( Params->StringIndex < Params->JsonStringLength )
    {
        char currentChar = Params->JsonString[Params->StringIndex];
        char nextChar = Params->JsonString[Params->StringIndex+1];
        char nextNextChar = 0 != nextChar ? Params->JsonString[Params->StringIndex+2] : 0;

        // See if currently in a comment and if this is the end of comment.
        if( inSingleLineComment && '\n' == currentChar )
        {
            inSingleLineComment = false;
        }
        else if( inMultiLineComment && '*' == currentChar && '/' == nextChar )
        {
            inMultiLineComment = false;
            Params->StringIndex  += 1;      // Skip the extra char (the '/')
        }
        else if( inSingleLineComment || inMultiLineComment )
        {
            // In comment, so ignore
        }
        else if(     ' '  == currentChar
            ||  '\n' == currentChar
            ||  '\r' == currentChar
            ||  '\t' == currentChar
            ||  ( '\v' == currentChar && Params->IsJson5 )
            ||  ( '\f' == currentChar && Params->IsJson5 ) )
        {
            // White space, so ignore
        }
        else if( Params->IsJson5 && '\xc2' == currentChar && '\xa0' == nextChar )
        {
            // Non-breaking space allowed by json5
            Params->StringIndex += 1;
        }
        else if(    Params->IsJson5
                 && (   ( '\xe2' == currentChar && '\x80' == nextChar && '\xa8' == nextNextChar )        // Line separator
                     || ( '\xe2' == currentChar && '\x80' == nextChar && '\xa9' == nextNextChar )        // Paragraph separator
                     || ( '\xef' == currentChar && '\xbb' == nextChar && '\xbf' == nextNextChar ) ) )    // Byte order mark
        {
            // Extra white space allowed by json5
            Params->StringIndex += 2;
        }
        else if( Params->IsJson5 && '/' == currentChar && '/' == nextChar )
        {
            inSingleLineComment = true;
            Params->StringIndex += 1;
        }
        else if( Params->IsJson5 && '/' == currentChar && '*' == nextChar )
        {
            inMultiLineComment = true;
            Params->StringIndex += 1;
        }
        else
        {
            // First non whitespace/comment
            *pNextChar = currentChar;
            jlStatus = JL_STATUS_SUCCESS;
            break;
        }

        Params->StringIndex += 1;
    }

    return jlStatus;
}